

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu-aarch64.cpp
# Opt level: O1

int repack_q4_0_to_q4_0_4_bl(ggml_tensor *t,int interleave_block,void *data,size_t data_size)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  undefined1 auVar5 [32];
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  char *pcVar10;
  int iVar11;
  undefined8 *puVar12;
  long lVar13;
  undefined8 uVar14;
  int iVar15;
  undefined1 (*pauVar16) [64];
  undefined1 (*pauVar17) [64];
  int i;
  long lVar18;
  ulong uVar19;
  undefined8 *puVar20;
  long lVar21;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar22 [16];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  block_q4_0x4 out;
  block_q4_0 dst_tmp [4];
  undefined1 local_c0 [64];
  undefined8 uStack_80;
  undefined8 local_78 [2];
  undefined2 auStack_68 [28];
  
  if (t->type == GGML_TYPE_Q4_0) {
    if ((interleave_block == 4) || (interleave_block == 8)) {
      pauVar16 = (undefined1 (*) [64])t->data;
      iVar8 = ggml_nrows(t);
      uVar9 = t->ne[0];
      uVar19 = uVar9 + 0x1f;
      if (-1 < (long)uVar9) {
        uVar19 = uVar9;
      }
      iVar11 = (int)((long)uVar19 >> 5);
      if ((long)(iVar8 * iVar11) * 0x12 == data_size) {
        iVar15 = -1;
        if ((uVar9 & 7) == 0 && (t->ne[1] & 3U) == 0) {
          if (0 < iVar8) {
            lVar13 = (long)iVar11;
            iVar15 = 0;
            auVar5 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
            auVar25 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
            auVar26 = vpbroadcastq_avx512f(ZEXT816(3));
            auVar41._8_4_ = 0xfffffff8;
            auVar41._0_8_ = 0xfffffff8fffffff8;
            auVar41._12_4_ = 0xfffffff8;
            auVar41._16_4_ = 0xfffffff8;
            auVar41._20_4_ = 0xfffffff8;
            auVar41._24_4_ = 0xfffffff8;
            auVar41._28_4_ = 0xfffffff8;
            auVar27 = vpbroadcastq_avx512f();
            auVar28 = vpbroadcastq_avx512f(ZEXT816(0x12));
            auVar29 = vpbroadcastq_avx512f(ZEXT816(0x8888888888888888));
            auVar30 = vpbroadcastq_avx512f(ZEXT816(8));
            auVar42._8_4_ = 8;
            auVar42._0_8_ = 0x800000008;
            auVar42._12_4_ = 8;
            auVar42._16_4_ = 8;
            auVar42._20_4_ = 8;
            auVar42._24_4_ = 8;
            auVar42._28_4_ = 8;
            auVar31 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
            auVar32 = vpbroadcastq_avx512f(ZEXT816(0x7ffffffc));
            auVar33 = vpbroadcastd_avx512f(ZEXT416(0x88888888));
            auVar34 = vpbroadcastq_avx512f(ZEXT816(0x10));
            do {
              if (0 < lVar13) {
                auVar35 = vpbroadcastq_avx512f();
                uVar9 = (ulong)(0x40U / (uint)interleave_block + 7 & 0xf8);
                lVar21 = 0;
                puVar12 = (undefined8 *)data;
                pauVar17 = pauVar16;
                do {
                  lVar18 = 0;
                  puVar20 = puVar12;
                  do {
                    *(undefined2 *)((long)auStack_68 + lVar18) = *(undefined2 *)(puVar20 + 2);
                    uVar14 = puVar20[1];
                    *(undefined8 *)((long)local_78 + lVar18) = *puVar20;
                    *(undefined8 *)((long)local_78 + lVar18 + 8) = uVar14;
                    puVar20 = (undefined8 *)((long)puVar20 + lVar13 * 0x12);
                    lVar18 = lVar18 + 0x12;
                  } while (lVar18 != 0x48);
                  lVar18 = 0;
                  puVar20 = local_78;
                  do {
                    *(undefined2 *)(local_c0 + lVar18 * 2) = *(undefined2 *)puVar20;
                    lVar18 = lVar18 + 1;
                    puVar20 = (undefined8 *)((long)puVar20 + 0x12);
                  } while (lVar18 != 4);
                  if (interleave_block == 8) {
                    uVar19 = 0;
                    auVar36 = vmovdqa64_avx512f(auVar25);
                    auVar23 = auVar5;
                    do {
                      uVar6 = vpcmpuq_avx512f(auVar36,auVar35,2);
                      auVar37 = vpandq_avx512f(auVar36,auVar26);
                      auVar24 = vpaddd_avx512vl(auVar23,auVar23);
                      auVar24 = vpandd_avx512vl(auVar24,auVar41);
                      auVar38 = vpmovsxdq_avx512f(auVar24);
                      auVar37 = vpmuldq_avx512f(auVar37,auVar28);
                      auVar37 = vpaddq_avx512f(auVar27,auVar37);
                      vpaddq_avx512f(auVar37,auVar38);
                      auVar22 = vpxord_avx512vl(auVar38._0_16_,auVar38._0_16_);
                      auVar38 = vpgatherqq_avx512f(*(undefined8 *)(uVar9 + 2));
                      bVar1 = (bool)((byte)uVar6 & 1);
                      auVar37._0_8_ = (ulong)bVar1 * auVar38._0_8_ | (ulong)!bVar1 * auVar22._0_8_;
                      bVar1 = (bool)((byte)(uVar6 >> 1) & 1);
                      auVar37._8_8_ = (ulong)bVar1 * auVar38._8_8_ | (ulong)!bVar1 * auVar22._8_8_;
                      auVar37._16_8_ = (ulong)((byte)(uVar6 >> 2) & 1) * auVar38._16_8_;
                      auVar37._24_8_ = (ulong)((byte)(uVar6 >> 3) & 1) * auVar38._24_8_;
                      auVar37._32_8_ = (ulong)((byte)(uVar6 >> 4) & 1) * auVar38._32_8_;
                      auVar37._40_8_ = (ulong)((byte)(uVar6 >> 5) & 1) * auVar38._40_8_;
                      auVar37._48_8_ = (ulong)((byte)(uVar6 >> 6) & 1) * auVar38._48_8_;
                      auVar37._56_8_ = (uVar6 >> 7) * auVar38._56_8_;
                      auVar37 = vpxorq_avx512f(auVar37,auVar29);
                      auVar37 = vmovdqu64_avx512f(auVar37);
                      *(undefined1 (*) [64])(local_c0 + uVar19 * 8 + 8) = auVar37;
                      uVar19 = uVar19 + 8;
                      auVar36 = vpaddq_avx512f(auVar36,auVar30);
                      auVar23 = vpaddd_avx2(auVar23,auVar42);
                    } while (uVar9 != uVar19);
                  }
                  else {
                    if (interleave_block != 4) {
                      pcVar10 = "false";
                      uVar14 = 0x1635;
                      goto LAB_00112b70;
                    }
                    uVar19 = 0;
                    auVar36 = vmovdqa64_avx512f(auVar25);
                    auVar37 = vmovdqa64_avx512f(auVar31);
                    do {
                      uVar6 = vpcmpuq_avx512f(auVar36,auVar35,2);
                      uVar7 = vpcmpuq_avx512f(auVar37,auVar35,2);
                      auVar38 = vpandq_avx512f(auVar37,auVar32);
                      auVar39 = vpandq_avx512f(auVar36,auVar32);
                      auVar40 = vpandq_avx512f(auVar36,auVar26);
                      auVar40 = vpmuldq_avx512f(auVar40,auVar28);
                      auVar39 = vpaddq_avx512f(auVar27,auVar39);
                      vpaddq_avx512f(auVar39,auVar40);
                      auVar39 = vpandq_avx512f(auVar37,auVar26);
                      auVar39 = vpmuldq_avx512f(auVar39,auVar28);
                      auVar38 = vpaddq_avx512f(auVar27,auVar38);
                      auVar38 = vpaddq_avx512f(auVar38,auVar39);
                      auVar22 = vpxord_avx512vl(auVar39._0_16_,auVar39._0_16_);
                      auVar23 = vpgatherqd_avx512f(*(undefined8 *)(uVar9 + 2));
                      bVar1 = (bool)((byte)uVar7 & 1);
                      auVar24._0_4_ = (uint)bVar1 * auVar23._0_4_ | (uint)!bVar1 * auVar22._0_4_;
                      bVar1 = (bool)((byte)(uVar7 >> 1) & 1);
                      auVar24._4_4_ = (uint)bVar1 * auVar23._4_4_ | (uint)!bVar1 * auVar22._4_4_;
                      bVar1 = (bool)((byte)(uVar7 >> 2) & 1);
                      auVar24._8_4_ = (uint)bVar1 * auVar23._8_4_ | (uint)!bVar1 * auVar22._8_4_;
                      bVar1 = (bool)((byte)(uVar7 >> 3) & 1);
                      auVar24._12_4_ = (uint)bVar1 * auVar23._12_4_ | (uint)!bVar1 * auVar22._12_4_;
                      auVar24._16_4_ = (uint)((byte)(uVar7 >> 4) & 1) * auVar23._16_4_;
                      auVar24._20_4_ = (uint)((byte)(uVar7 >> 5) & 1) * auVar23._20_4_;
                      auVar24._24_4_ = (uint)((byte)(uVar7 >> 6) & 1) * auVar23._24_4_;
                      auVar24._28_4_ = (uint)(byte)(uVar7 >> 7) * auVar23._28_4_;
                      auVar22 = vpxord_avx512vl(auVar38._0_16_,auVar38._0_16_);
                      auVar23 = vpgatherqd_avx512f(*(undefined8 *)((long)data + 2));
                      bVar1 = (bool)((byte)uVar6 & 1);
                      bVar2 = (bool)((byte)(uVar6 >> 1) & 1);
                      bVar3 = (bool)((byte)(uVar6 >> 2) & 1);
                      bVar4 = (bool)((byte)(uVar6 >> 3) & 1);
                      auVar38 = vinserti64x4_avx512f
                                          (ZEXT3264(CONCAT428((uint)(byte)(uVar6 >> 7) *
                                                              auVar23._28_4_,
                                                              CONCAT424((uint)((byte)(uVar6 >> 6) &
                                                                              1) * auVar23._24_4_,
                                                                        CONCAT420((uint)((byte)(
                                                  uVar6 >> 5) & 1) * auVar23._20_4_,
                                                  CONCAT416((uint)((byte)(uVar6 >> 4) & 1) *
                                                            auVar23._16_4_,
                                                            CONCAT412((uint)bVar4 * auVar23._12_4_ |
                                                                      (uint)!bVar4 * auVar22._12_4_,
                                                                      CONCAT48((uint)bVar3 *
                                                                               auVar23._8_4_ |
                                                                               (uint)!bVar3 *
                                                                               auVar22._8_4_,
                                                                               CONCAT44((uint)bVar2
                                                                                        * auVar23.
                                                  _4_4_ | (uint)!bVar2 * auVar22._4_4_,
                                                  (uint)bVar1 * auVar23._0_4_ |
                                                  (uint)!bVar1 * auVar22._0_4_)))))))),auVar24,1);
                      auVar38 = vpxord_avx512f(auVar38,auVar33);
                      auVar38 = vmovdqu32_avx512f(auVar38);
                      *(undefined1 (*) [64])(local_c0 + uVar19 * 4 + 8) = auVar38;
                      uVar19 = uVar19 + 0x10;
                      auVar36 = vpaddq_avx512f(auVar36,auVar34);
                      auVar37 = vpaddq_avx512f(auVar37,auVar34);
                    } while ((0x40U / (uint)interleave_block + 0xf & 0xf0) != uVar19);
                  }
                  pauVar16 = (undefined1 (*) [64])(pauVar17[1] + 8);
                  *(undefined8 *)pauVar17[1] = uStack_80;
                  auVar36 = vmovdqu64_avx512f(local_c0);
                  auVar36 = vmovdqu64_avx512f(auVar36);
                  *pauVar17 = auVar36;
                  lVar21 = lVar21 + 1;
                  puVar12 = (undefined8 *)((long)puVar12 + 0x12);
                  pauVar17 = pauVar16;
                } while (lVar21 != lVar13);
              }
              iVar15 = iVar15 + 4;
              data = (void *)((long)data + (long)(iVar11 * 4) * 0x12);
            } while (iVar15 < iVar8);
          }
          iVar15 = 0;
        }
        return iVar15;
      }
      pcVar10 = "data_size == nrow * nblocks * sizeof(block_q4_0)";
      uVar14 = 0x16ae;
    }
    else {
      pcVar10 = "interleave_block == 4 || interleave_block == 8";
      uVar14 = 0x16a5;
    }
  }
  else {
    pcVar10 = "t->type == GGML_TYPE_Q4_0";
    uVar14 = 0x16a4;
  }
LAB_00112b70:
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ggml-cpu-aarch64.cpp"
             ,uVar14,"GGML_ASSERT(%s) failed",pcVar10);
}

Assistant:

static int repack_q4_0_to_q4_0_4_bl(struct ggml_tensor * t, int interleave_block, const void * GGML_RESTRICT data, size_t data_size) {
    GGML_ASSERT(t->type == GGML_TYPE_Q4_0);
    GGML_ASSERT(interleave_block == 4 || interleave_block == 8);
    constexpr int nrows_interleaved = 4;

    block_q4_0x4 * dst = (block_q4_0x4 *)t->data;
    const block_q4_0 * src = (const block_q4_0 *)data;
    block_q4_0 dst_tmp[4];
    int nrow = ggml_nrows(t);
    int nblocks = t->ne[0] / QK4_0;

    GGML_ASSERT(data_size == nrow * nblocks * sizeof(block_q4_0));

    if (t->ne[1] % nrows_interleaved != 0 || t->ne[0] % 8 != 0) {
        return -1;
    }

    for (int b = 0; b < nrow; b += nrows_interleaved) {
        for (int64_t x = 0; x < nblocks; x++) {
            for (int i = 0; i < nrows_interleaved; i++) {
                dst_tmp[i] = src[x + i * nblocks];
            }
            *dst++ = make_block_q4_0x4(dst_tmp, interleave_block);
        }
        src += nrows_interleaved * nblocks;
    }
    return 0;

    GGML_UNUSED(data_size);
}